

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *ppuVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  ostream *poVar5;
  char *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_t tiledata_size;
  size_t tiles_x;
  size_t tiles_y;
  size_type sVar7;
  ostream *local_11c0;
  bool local_1119;
  bool local_10d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0;
  undefined1 local_f90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_rle;
  size_t data_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  undefined1 local_f18 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tiledata_rle;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tilemap_rle;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tiledata;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tilemap;
  Tilemap map;
  ostream *output_stream;
  ofstream osfile;
  locale local_c28 [15];
  byte local_c19;
  locale local_c18 [15];
  byte local_c09;
  locale local_c08 [15];
  byte local_bf9;
  locale local_bf8 [8];
  locale local_bf0 [15];
  byte local_be1;
  locale local_be0 [8];
  locale local_bd8 [12];
  int local_bcc;
  string local_bc8 [4];
  Target target;
  string local_ba8 [32];
  undefined1 local_b88 [8];
  string name;
  Image img;
  string local_b40;
  allocator local_b19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  allocator local_af1;
  string local_af0;
  allocator local_ac9;
  string local_ac8;
  undefined1 local_aa8 [8];
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outputArg;
  string local_990;
  allocator local_969;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  allocator local_941;
  string local_940;
  allocator local_919;
  string local_918;
  undefined1 local_8f8 [8];
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  imageArg;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  allocator local_791;
  string local_790;
  undefined1 local_770 [8];
  SwitchArg rleSwitch;
  string local_6c0;
  allocator local_699;
  string local_698;
  allocator local_671;
  string local_670;
  undefined1 local_650 [8];
  SwitchArg size8x16Switch;
  string local_5a0;
  allocator local_579;
  string local_578;
  allocator local_551;
  string local_550;
  undefined1 local_530 [8];
  SwitchArg spriteSwitch;
  string local_480;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  undefined1 local_410 [8];
  SwitchArg mapSwitch;
  string local_360;
  allocator local_339;
  string local_338;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  undefined1 local_2c8 [8];
  ValueArg<int> offsetArg;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  undefined1 local_1a0 [8];
  StdOutput std_output;
  string local_150;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  CmdLine cmd;
  char **argv_local;
  int argc_local;
  
  cmd._216_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"Convert image to Game Boy sprite or background data",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,"0.1",(allocator *)(std_output.author.field_2._M_local_buf + 0xf))
  ;
  TCLAP::CmdLine::CmdLine((CmdLine *)local_f8,&local_118,' ',&local_150,true);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)(std_output.author.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"imgtogb",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,"Simon Larsen <simonhffh@gmail.com>",
             (allocator *)((long)&offsetArg._constraint + 7));
  imgtogb::StdOutput::StdOutput((StdOutput *)local_1a0,&local_1c0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&offsetArg._constraint + 7));
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  TCLAP::CmdLine::setOutput((CmdLine *)local_f8,(CmdLineOutput *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"O",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"offset",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"Tile map offset.",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_360,"offset",(allocator *)&mapSwitch.super_Arg.field_0xa7);
  TCLAP::ValueArg<int>::ValueArg
            ((ValueArg<int> *)local_2c8,&local_2e8,&local_310,&local_338,false,0,&local_360,
             (CmdLineInterface *)local_f8,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&mapSwitch.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"map",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_480,"Produce tile map",(allocator *)&spriteSwitch.super_Arg.field_0xa7
            );
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_410,&local_430,&local_458,&local_480,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&spriteSwitch.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"sprite",&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a0,"Produce sprite tiles",
             (allocator *)&size8x16Switch.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_530,&local_550,&local_578,&local_5a0,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&size8x16Switch.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  TCLAP::CmdLine::xorAdd((CmdLine *)local_f8,(Arg *)local_410,(Arg *)local_530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_670,"",&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"8x16",&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6c0,"Enable 8x16 sprite mode.",
             (allocator *)&rleSwitch.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_650,&local_670,&local_698,&local_6c0,(CmdLineInterface *)local_f8,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&rleSwitch.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_790,"r",&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7b8,"rle",&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7e0,"Compress data using RLE.",
             (allocator *)
             ((long)&imageArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_770,&local_790,&local_7b8,&local_7e0,(CmdLineInterface *)local_f8,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&imageArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_918,"image",&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_940,"Image file path",&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_968,"",&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_990,"IMAGE",
             (allocator *)
             ((long)&outputArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_8f8,&local_918,&local_940,true,&local_968,&local_990,
                      (CmdLineInterface *)local_f8,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&outputArg.
                     super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._constraint + 7));
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator((allocator<char> *)&local_941);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ac8,"output",&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_af0,"Output file path",&local_af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b18,"",&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b40,"OUTPUT",(allocator *)((long)&img._data + 7));
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_aa8,&local_ac8,&local_af0,true,&local_b18,&local_b40,
                      (CmdLineInterface *)local_f8,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator((allocator<char> *)((long)&img._data + 7));
  std::__cxx11::string::~string((string *)&local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::__cxx11::string::~string((string *)&local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  TCLAP::CmdLine::parse((CmdLine *)local_f8,argc,(char **)cmd._216_8_);
  piVar4 = TCLAP::ValueArg<int>::getValue((ValueArg<int> *)local_2c8);
  if (*piVar4 < 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"error: Tile map offset must be non-negative.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    img._data._0_4_ = 1;
    goto LAB_00129493;
  }
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_8f8);
  filename = (char *)std::__cxx11::string::c_str();
  cimg_library::CImg<unsigned_char>::CImg((CImg<unsigned_char> *)((long)&name.field_2 + 8),filename)
  ;
  std::__cxx11::string::string((string *)local_b88);
  bVar2 = TCLAP::Arg::isSet((Arg *)local_aa8);
  if (bVar2) {
    TCLAP::
    ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_aa8);
    basename((char *)local_ba8);
    std::__cxx11::string::operator=((string *)local_b88,local_ba8);
    std::__cxx11::string::~string(local_ba8);
  }
  else {
    TCLAP::
    ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_8f8);
    basename((char *)local_bc8);
    std::__cxx11::string::operator=((string *)local_b88,local_bc8);
    std::__cxx11::string::~string(local_bc8);
  }
  local_be1 = 0;
  pbVar6 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_aa8);
  std::locale::locale(local_bd8);
  bVar2 = boost::algorithm::iends_with<std::__cxx11::string,char[3]>
                    (pbVar6,(char (*) [3])".h",local_bd8);
  local_10d9 = true;
  if (!bVar2) {
    pbVar6 = TCLAP::
             ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_aa8);
    std::locale::locale(local_be0);
    local_be1 = 1;
    local_10d9 = boost::algorithm::iends_with<std::__cxx11::string,char[3]>
                           (pbVar6,(char (*) [3])".c",local_be0);
  }
  if ((local_be1 & 1) != 0) {
    std::locale::~locale(local_be0);
  }
  std::locale::~locale(local_bd8);
  if (local_10d9 == false) {
    local_bf9 = 0;
    local_c09 = 0;
    local_c19 = 0;
    bVar2 = false;
    pbVar6 = TCLAP::
             ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_aa8);
    std::locale::locale(local_bf0);
    bVar3 = boost::algorithm::iends_with<std::__cxx11::string,char[5]>
                      (pbVar6,(char (*) [5])".asm",local_bf0);
    local_1119 = true;
    if (!bVar3) {
      pbVar6 = TCLAP::
               ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_aa8);
      std::locale::locale(local_bf8);
      local_bf9 = 1;
      bVar3 = boost::algorithm::iends_with<std::__cxx11::string,char[3]>
                        (pbVar6,(char (*) [3])".s",local_bf8);
      local_1119 = true;
      if (!bVar3) {
        pbVar6 = TCLAP::
                 ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_aa8);
        std::locale::locale(local_c08);
        local_c09 = 1;
        bVar3 = boost::algorithm::iends_with<std::__cxx11::string,char[7]>
                          (pbVar6,(char (*) [7])".gbz80",local_c08);
        local_1119 = true;
        if (!bVar3) {
          pbVar6 = TCLAP::
                   ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_aa8);
          std::locale::locale(local_c18);
          local_c19 = 1;
          bVar3 = boost::algorithm::iends_with<std::__cxx11::string,char[5]>
                            (pbVar6,(char (*) [5])".z80",local_c18);
          local_1119 = true;
          if (!bVar3) {
            pbVar6 = TCLAP::
                     ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_aa8);
            std::locale::locale(local_c28);
            bVar2 = true;
            local_1119 = boost::algorithm::iends_with<std::__cxx11::string,char[5]>
                                   (pbVar6,(char (*) [5])0x17a589,local_c28);
          }
        }
      }
    }
    if (bVar2) {
      std::locale::~locale(local_c28);
    }
    if ((local_c19 & 1) != 0) {
      std::locale::~locale(local_c18);
    }
    if ((local_c09 & 1) != 0) {
      std::locale::~locale(local_c08);
    }
    if ((local_bf9 & 1) != 0) {
      std::locale::~locale(local_bf8);
    }
    std::locale::~locale(local_bf0);
    if (local_1119 != false) {
      local_bcc = 1;
      goto LAB_00128e69;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"error: Unknown file ending for output file");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Known types:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cerr,"\tC: .c, .asm ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cerr,"\tRGBDS: .asm, .s, .gbz80, .z80, .inc");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    img._data._0_4_ = 1;
  }
  else {
    local_bcc = 0;
LAB_00128e69:
    std::ofstream::ofstream(&output_stream);
    bVar2 = TCLAP::Arg::isSet((Arg *)local_aa8);
    if (bVar2) {
      pbVar6 = TCLAP::
               ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_aa8);
      std::ofstream::open(&output_stream,pbVar6,0x10);
      local_11c0 = (ostream *)&output_stream;
    }
    else {
      local_11c0 = (ostream *)&std::cout;
    }
    bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_410);
    if (bVar2) {
      piVar4 = TCLAP::ValueArg<int>::getValue((ValueArg<int> *)local_2c8);
      imgtogb::Tilemap::Tilemap
                ((Tilemap *)
                 &tilemap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Image *)((long)&name.field_2 + 8),
                 *piVar4);
      ppuVar1 = &tiledata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &tilemap_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      imgtogb::Tilemap::getTileMap
                ((Tilemap *)
                 &tilemap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      imgtogb::Tilemap::getTileData
                ((Tilemap *)
                 &tilemap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &tilemap_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_770);
      if (bVar2) {
        ppuVar1 = &tiledata_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f18);
        imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &tiledata.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
        imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &tilemap_rle.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f18);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &tiledata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &tiledata_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &tilemap_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f18);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f18);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &tiledata_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (local_bcc == 0) {
        tiledata_size =
             imgtogb::Tilemap::getTileDataSize
                       ((Tilemap *)
                        &tilemap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
        tiles_x = imgtogb::Tilemap::getTilesX
                            ((Tilemap *)
                             &tilemap.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        tiles_y = imgtogb::Tilemap::getTilesY
                            ((Tilemap *)
                             &tilemap.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        piVar4 = TCLAP::ValueArg<int>::getValue((ValueArg<int> *)local_2c8);
        emitMapCHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &tiledata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,tiledata_size,tiles_x,
                       tiles_y,*piVar4,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &tilemap_rle.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(string *)local_b88,local_11c0);
      }
      else if (local_bcc == 1) {
        std::operator+(&local_f38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b88,"_data");
        emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &tilemap_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f38,local_11c0);
        std::__cxx11::string::~string((string *)&local_f38);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b88,"_tiles");
        emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &tiledata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)
                     &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,local_11c0);
        std::__cxx11::string::~string
                  ((string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &tilemap_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &tiledata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      imgtogb::Tilemap::~Tilemap
                ((Tilemap *)
                 &tilemap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length);
      bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_650);
      produceSpriteData((Image *)((long)&name.field_2 + 8),bVar2,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length);
      data_rle.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(sVar7 >> 4);
      bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_770);
      if (bVar2) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f90);
        imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f90);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f90);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f90);
      }
      if (local_bcc == 0) {
        emitSpriteCHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length,
                          (size_t)data_rle.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (string *)local_b88,local_11c0);
      }
      else if (local_bcc == 1) {
        std::operator+(&local_fb0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b88,"_data");
        emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length,
                     &local_fb0,local_11c0);
        std::__cxx11::string::~string((string *)&local_fb0);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_length);
    }
    argv_local._4_4_ = 0;
    img._data._0_4_ = 1;
    std::ofstream::~ofstream(&output_stream);
  }
  std::__cxx11::string::~string((string *)local_b88);
  cimg_library::CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)((long)&name.field_2 + 8));
LAB_00129493:
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~UnlabeledValueArg
            ((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_aa8);
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~UnlabeledValueArg
            ((UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_8f8);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_770);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_650);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_530);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_410);
  TCLAP::ValueArg<int>::~ValueArg((ValueArg<int> *)local_2c8);
  imgtogb::StdOutput::~StdOutput((StdOutput *)local_1a0);
  TCLAP::CmdLine::~CmdLine((CmdLine *)local_f8);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[]) {
	TCLAP::CmdLine cmd("Convert image to Game Boy sprite or background data",' ',"0.1");
	imgtogb::StdOutput std_output("imgtogb", "Simon Larsen <simonhffh@gmail.com>");
	cmd.setOutput(&std_output);

	TCLAP::ValueArg<int> offsetArg("O", "offset", "Tile map offset.", false, 0, "offset", cmd);
	TCLAP::SwitchArg mapSwitch("", "map", "Produce tile map", false);
	TCLAP::SwitchArg spriteSwitch("", "sprite", "Produce sprite tiles", false);
	cmd.xorAdd(mapSwitch, spriteSwitch);
	TCLAP::SwitchArg size8x16Switch("", "8x16", "Enable 8x16 sprite mode.", cmd);
	TCLAP::SwitchArg rleSwitch("r", "rle", "Compress data using RLE.", cmd);
	TCLAP::UnlabeledValueArg<std::string> imageArg("image", "Image file path", true, "", "IMAGE", cmd);
	TCLAP::UnlabeledValueArg<std::string> outputArg("output", "Output file path", true, "", "OUTPUT", cmd);

	cmd.parse(argc, argv);

	if(offsetArg.getValue() < 0) {
		std::cerr << "error: Tile map offset must be non-negative." << std::endl;
		return 1;
	}

	Image img(imageArg.getValue().c_str());

	// Get basename
	std::string name;
	if(outputArg.isSet()) {
		name = basename(outputArg.getValue());
	} else {
		name = basename(imageArg.getValue());
	}

	// Determine output file ending
	Target target;
	if(boost::algorithm::iends_with(outputArg.getValue(), ".h")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".c")) {
		target = Target::C;
	}
	else if(boost::algorithm::iends_with(outputArg.getValue(), ".asm")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".s")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".gbz80")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".z80")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".inc")) {
		target = Target::ASM;
	}
	else {
		std::cerr << "error: Unknown file ending for output file" << std::endl;
		std::cerr << "Known types:" << std::endl;
		std::cerr << "\tC: .c, .asm " << std::endl;
		std::cerr << "\tRGBDS: .asm, .s, .gbz80, .z80, .inc" << std::endl;
		return 1;
	}

	// Get output stream
	std::ofstream osfile;
	std::ostream &output_stream = outputArg.isSet()
		? osfile.open(outputArg.getValue()), osfile
		: std::cout;

	// Output tile map
	if(mapSwitch.getValue()) {
		Tilemap map(img, offsetArg.getValue());
		std::vector<unsigned char> tilemap, tiledata;
		map.getTileMap(tilemap);
		map.getTileData(tiledata);
		if(rleSwitch.getValue()) {
			std::vector<unsigned char> tilemap_rle, tiledata_rle;
			rle_encode(tilemap, tilemap_rle);
			rle_encode(tiledata, tiledata_rle);
			tilemap.swap(tilemap_rle);
			tiledata.swap(tiledata_rle);
		}
		if(target == Target::C) {
			emitMapCHeader(tilemap, map.getTileDataSize(), map.getTilesX(), map.getTilesY(), offsetArg.getValue(), tiledata, name, output_stream);
		} else if(target == Target::ASM) {
			emitASMArray(tiledata, name+"_data", output_stream);
			emitASMArray(tilemap, name+"_tiles", output_stream);
		}
	}
	// Output sprite data
	else {
		std::vector<unsigned char> data;
		produceSpriteData(img, size8x16Switch.getValue(), data);
		size_t data_length = data.size() / 16;
		if(rleSwitch.getValue()) {
			std::vector<unsigned char> data_rle;
			rle_encode(data, data_rle);
			data.swap(data_rle);
		}
		if(target == Target::C) {
			emitSpriteCHeader(data, data_length, name, output_stream);
		} else if(target == Target::ASM) {
			emitASMArray(data, name+"_data", output_stream);
		}
	}

	return 0;
}